

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O3

int blake2s_update(blake2s_state *S,void *pin,size_t inlen)

{
  uint uVar1;
  size_t sVar2;
  uchar *in;
  ulong __n;
  
  if (inlen != 0) {
    sVar2 = S->buflen;
    __n = 0x40 - sVar2;
    if (__n <= inlen && inlen - __n != 0) {
      S->buflen = 0;
      memcpy(S->buf + sVar2,pin,__n);
      uVar1 = S->t[0];
      S->t[0] = uVar1 + 0x40;
      S->t[1] = (S->t[1] + 1) - (uint)(uVar1 < 0xffffffc0);
      blake2s_compress(S,S->buf);
      pin = (void *)((long)pin + __n);
      for (inlen = inlen - __n; 0x40 < inlen; inlen = inlen - 0x40) {
        uVar1 = S->t[0];
        S->t[0] = uVar1 + 0x40;
        S->t[1] = (S->t[1] + 1) - (uint)(uVar1 < 0xffffffc0);
        blake2s_compress(S,(uint8_t *)pin);
        pin = (void *)((long)pin + 0x40);
      }
    }
    memcpy(S->buf + S->buflen,pin,inlen);
    S->buflen = S->buflen + inlen;
  }
  return 0;
}

Assistant:

int blake2s_update( blake2s_state *S, const void *pin, size_t inlen )
{
  const unsigned char * in = (const unsigned char *)pin;
  if( inlen > 0 )
  {
    size_t left = S->buflen;
    size_t fill = BLAKE2S_BLOCKBYTES - left;
    if( inlen > fill )
    {
      S->buflen = 0;
      memcpy( S->buf + left, in, fill ); /* Fill buffer */
      blake2s_increment_counter( S, BLAKE2S_BLOCKBYTES );
      blake2s_compress( S, S->buf ); /* Compress */
      in += fill; inlen -= fill;
      while(inlen > BLAKE2S_BLOCKBYTES) {
        blake2s_increment_counter(S, BLAKE2S_BLOCKBYTES);
        blake2s_compress( S, in );
        in += BLAKE2S_BLOCKBYTES;
        inlen -= BLAKE2S_BLOCKBYTES;
      }
    }
    memcpy( S->buf + S->buflen, in, inlen );
    S->buflen += inlen;
  }
  return 0;
}